

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_type sVar5;
  reference pvVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end;
  llama_context *plVar7;
  undefined8 uVar8;
  pca_params pca_params;
  bool use_pca;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> v_diff_filtered;
  tokenized_prompt t_1;
  bool success;
  size_t i_1;
  tokenized_prompt t;
  size_t i;
  size_t n_total_tokens;
  vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> tokenized_prompts;
  train_context ctx_train;
  char model_hint [128];
  int n_embd;
  int n_layers;
  llama_context *ctx;
  llama_model *model;
  common_init_result llama_init;
  callback_data cb_data;
  common_params params;
  value_type *in_stack_ffffffffffffe8a8;
  common_params *in_stack_ffffffffffffe8b0;
  undefined6 in_stack_ffffffffffffe8c0;
  undefined1 in_stack_ffffffffffffe8c6;
  undefined1 in_stack_ffffffffffffe8c7;
  tokenized_prompt *in_stack_ffffffffffffe8c8;
  tokenized_prompt *in_stack_ffffffffffffe8d0;
  train_context *in_stack_ffffffffffffe8d8;
  uint in_stack_ffffffffffffe8e0;
  uint in_stack_ffffffffffffe8e4;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffe8e8;
  train_context *in_stack_ffffffffffffe8f0;
  llama_context *ctx_00;
  train_context *in_stack_ffffffffffffe910;
  undefined4 in_stack_ffffffffffffe920;
  undefined2 in_stack_ffffffffffffe92c;
  allocator<char> in_stack_ffffffffffffe92f;
  string local_16d0 [16];
  train_context *in_stack_ffffffffffffe940;
  common_params *in_stack_ffffffffffffe948;
  string local_16b0 [24];
  string *in_stack_ffffffffffffe968;
  undefined4 in_stack_ffffffffffffe970;
  int in_stack_ffffffffffffe974;
  int in_stack_ffffffffffffe978;
  int in_stack_ffffffffffffe97c;
  undefined1 transpose;
  train_context *in_stack_ffffffffffffe980;
  int in_stack_ffffffffffffe988;
  int in_stack_ffffffffffffe98c;
  uint uVar9;
  train_context *in_stack_ffffffffffffe990;
  string local_1648 [32];
  int *local_1628;
  int *local_1620;
  string local_1618 [32];
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> local_15f8;
  undefined1 local_15e0 [80];
  string local_1590 [80];
  long local_1540;
  ulong local_1538;
  common_params *in_stack_ffffffffffffead0;
  ulong uVar10;
  vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> local_1528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14e8 [4];
  undefined1 local_1488 [128];
  undefined4 local_1408;
  undefined4 local_1404;
  train_context *local_1400;
  pointer local_13f8;
  undefined4 local_13c0;
  uint local_13bc;
  undefined1 local_13b8;
  int local_1368;
  common_params *in_stack_ffffffffffffed88;
  undefined4 local_ca8;
  _func_void_int_char_ptr_ptr *in_stack_fffffffffffffc40;
  llama_example in_stack_fffffffffffffc4c;
  common_params *in_stack_fffffffffffffc50;
  char **in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  int local_88;
  int local_84;
  int local_80;
  string local_30 [44];
  int local_4;
  
  local_4 = 0;
  common_params::common_params(in_stack_ffffffffffffead0);
  std::__cxx11::string::operator=(local_30,"control_vector.gguf");
  uVar2 = common_params_parse(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                              in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                              in_stack_fffffffffffffc40);
  if ((bool)uVar2) {
    if (local_84 % local_88 == 0) {
      callback_data::callback_data((callback_data *)in_stack_ffffffffffffe8b0);
      fprintf(_stderr,"%s: build = %d (%s)\n","main",(ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT);
      fprintf(_stderr,"%s: built with %s for %s\n","main",LLAMA_COMPILER,LLAMA_BUILD_TARGET);
      llama_backend_init();
      llama_numa_init(local_ca8);
      common_init_from_params(in_stack_ffffffffffffed88);
      local_13f8 = std::unique_ptr<llama_model,_llama_model_deleter>::get
                             ((unique_ptr<llama_model,_llama_model_deleter> *)
                              in_stack_ffffffffffffe8b0);
      local_1400 = (train_context *)
                   std::unique_ptr<llama_context,_llama_context_deleter>::get
                             ((unique_ptr<llama_context,_llama_context_deleter> *)
                              in_stack_ffffffffffffe8b0);
      uVar3 = llama_model_n_layer(local_13f8);
      local_1404 = uVar3;
      uVar4 = llama_model_n_embd(local_13f8);
      local_1408 = uVar4;
      llama_model_meta_val_str(local_13f8,"general.architecture",local_1488,0x80);
      train_context::train_context
                (in_stack_ffffffffffffe990,in_stack_ffffffffffffe98c,in_stack_ffffffffffffe988);
      prepare_entries(in_stack_ffffffffffffe948,in_stack_ffffffffffffe940);
      std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::vector
                ((vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> *)0x17a694);
      uVar10 = 0;
      for (local_1538 = 0; uVar1 = local_1538,
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_1500), uVar1 < sVar5; local_1538 = local_1538 + 1) {
        in_stack_ffffffffffffe910 = local_1400;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_1500,local_1538);
        std::__cxx11::string::string(local_1590,(string *)pvVar6);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_14e8,local_1538);
        std::__cxx11::string::string((string *)(local_15e0 + 0x30),(string *)pvVar6);
        tokenized_prompt::tokenized_prompt
                  ((tokenized_prompt *)in_stack_ffffffffffffe980,
                   (llama_context *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978),
                   (string *)CONCAT44(in_stack_ffffffffffffe974,in_stack_ffffffffffffe970),
                   in_stack_ffffffffffffe968);
        std::__cxx11::string::~string((string *)(local_15e0 + 0x30));
        std::__cxx11::string::~string(local_1590);
        uVar10 = uVar10 + local_1540 * 2;
        std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::push_back
                  ((vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> *)
                   in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
        tokenized_prompt::~tokenized_prompt((tokenized_prompt *)in_stack_ffffffffffffe8b0);
      }
      begin._M_current = (int *)std::operator<<((ostream *)&std::cout,"n_total_tokens: ");
      end._M_current = (int *)std::ostream::operator<<((ostream *)begin._M_current,uVar10);
      std::ostream::operator<<((ostream *)end._M_current,std::endl<char,std::char_traits<char>>);
      local_15e0._40_8_ = (llama_context *)0x0;
      while( true ) {
        ctx_00 = (llama_context *)local_15e0._40_8_;
        plVar7 = (llama_context *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_1500);
        transpose = (undefined1)((uint)in_stack_ffffffffffffe97c >> 0x18);
        if (plVar7 <= ctx_00) break;
        local_15e0[0x27] = 0;
        std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::operator[]
                  (&local_1528,local_15e0._40_8_);
        tokenized_prompt::tokenized_prompt(in_stack_ffffffffffffe8d0,in_stack_ffffffffffffe8c8);
        local_13c0 = local_1404;
        local_13bc = local_15e0._24_4_;
        in_stack_ffffffffffffe8e0 = local_15e0._40_4_ + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_1500);
        in_stack_ffffffffffffe8e4 = (uint)sVar5;
        in_stack_ffffffffffffe8e8 = &local_15f8;
        in_stack_ffffffffffffe8f0 = local_1400;
        local_1620 = (int *)std::vector<int,_std::allocator<int>_>::cbegin
                                      (&in_stack_ffffffffffffe8a8->tokens_pos);
        local_1628 = (int *)std::vector<int,_std::allocator<int>_>::cend
                                      (&in_stack_ffffffffffffe8a8->tokens_pos);
        tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  (ctx_00,begin,end);
        in_stack_ffffffffffffe8c8 = (tokenized_prompt *)std::__cxx11::string::c_str();
        in_stack_ffffffffffffe8d0 = (tokenized_prompt *)local_15e0;
        in_stack_ffffffffffffe8d8 = local_1400;
        std::vector<int,_std::allocator<int>_>::cbegin(&in_stack_ffffffffffffe8a8->tokens_pos);
        std::vector<int,_std::allocator<int>_>::cend(&in_stack_ffffffffffffe8a8->tokens_pos);
        tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  (ctx_00,begin,end);
        uVar8 = std::__cxx11::string::c_str();
        printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",
               (ulong)in_stack_ffffffffffffe8e0,(ulong)in_stack_ffffffffffffe8e4,
               in_stack_ffffffffffffe8c8,uVar8,(ulong)(uint)local_15e0._24_4_);
        std::__cxx11::string::~string(local_1648);
        std::__cxx11::string::~string(local_1618);
        local_13b8 = 1;
        in_stack_ffffffffffffe8c7 =
             get_hidden_layers((llama_context *)
                               CONCAT17(in_stack_ffffffffffffe92f,
                                        CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffe92c,uVar3))),
                               (vector<int,_std::allocator<int>_> *)
                               CONCAT44(uVar4,in_stack_ffffffffffffe920));
        local_15e0[0x27] = in_stack_ffffffffffffe8c7;
        if ((bool)in_stack_ffffffffffffe8c7) {
          local_13b8 = 0;
          in_stack_ffffffffffffe8c6 =
               get_hidden_layers((llama_context *)
                                 CONCAT17(in_stack_ffffffffffffe92f,
                                          CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffe92c,uVar3)))
                                 ,(vector<int,_std::allocator<int>_> *)
                                  CONCAT44(uVar4,in_stack_ffffffffffffe920));
          local_15e0[0x27] = in_stack_ffffffffffffe8c6;
          if ((bool)in_stack_ffffffffffffe8c6) {
            callback_data::calc_diff((callback_data *)begin._M_current);
            train_context::concat_diff_tmp(in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8);
            callback_data::reset((callback_data *)in_stack_ffffffffffffe910);
            std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~vector
                      ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                       CONCAT17(in_stack_ffffffffffffe8c7,
                                CONCAT16(in_stack_ffffffffffffe8c6,in_stack_ffffffffffffe8c0)));
            local_1368 = 0;
          }
          else {
            local_1368 = 7;
          }
        }
        else {
          local_1368 = 7;
        }
        tokenized_prompt::~tokenized_prompt((tokenized_prompt *)in_stack_ffffffffffffe8b0);
        transpose = (undefined1)((uint)in_stack_ffffffffffffe97c >> 0x18);
        if (local_1368 != 0) break;
        local_15e0._40_8_ = local_15e0._40_8_ + 1;
      }
      printf("Done evaluate prompts, unload model...\n");
      uVar9 = CONCAT13(local_80 == 0,(int3)in_stack_ffffffffffffe98c);
      train_context::build_v_diff(in_stack_ffffffffffffe980,(bool)transpose);
      if ((uVar9 & 0x1000000) == 0) {
        mean::run((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)end._M_current,
                  (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)ctx_00);
      }
      else {
        PCA::pca_params::pca_params((pca_params *)&stack0xffffffffffffe974);
        PCA::run_pca((pca_params *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                     (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                     in_stack_ffffffffffffe8d8,
                     (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)
                     in_stack_ffffffffffffe8d0);
      }
      in_stack_ffffffffffffe8b0 = (common_params *)(local_14e8 + 2);
      std::__cxx11::string::string(local_16b0,local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8f0,(char *)in_stack_ffffffffffffe8e8,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
      export_gguf((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)in_stack_ffffffffffffe990
                  ,(string *)CONCAT44(uVar9,in_stack_ffffffffffffe988),
                  (string *)in_stack_ffffffffffffe980);
      std::__cxx11::string::~string(local_16d0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe92f);
      std::__cxx11::string::~string(local_16b0);
      llama_backend_free();
      local_4 = 0;
      local_1368 = 1;
      std::vector<tokenized_prompt,_std::allocator<tokenized_prompt>_>::~vector
                ((vector<tokenized_prompt,_std::allocator<tokenized_prompt>_> *)
                 CONCAT17(in_stack_ffffffffffffe8c7,
                          CONCAT16(in_stack_ffffffffffffe8c6,in_stack_ffffffffffffe8c0)));
      train_context::~train_context(in_stack_ffffffffffffe8f0);
      common_init_result::~common_init_result((common_init_result *)in_stack_ffffffffffffe8b0);
      callback_data::~callback_data((callback_data *)in_stack_ffffffffffffe8b0);
    }
    else {
      fprintf(_stderr,"PCA iterations must by multiply of PCA batch size\n");
      local_4 = 1;
      local_1368 = 1;
    }
  }
  else {
    local_4 = 1;
    local_1368 = 1;
  }
  common_params::~common_params(in_stack_ffffffffffffe8b0);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.out_file = "control_vector.gguf";

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_CVECTOR_GENERATOR, print_usage)) {
        return 1;
    }

    if (params.n_pca_iterations % params.n_pca_batch != 0) {
        fprintf(stderr, "PCA iterations must by multiply of PCA batch size\n");
        return 1;
    }


    callback_data cb_data;

    // pass the callback to the backend scheduler
    // it will be executed for each node during the graph computation
    params.cb_eval = cb_eval;
    params.cb_eval_user_data = &cb_data;
    params.warmup = false;

    print_build_info();
    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model to get hparams
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    // int n_ctx = llama_n_ctx(ctx);
    int n_layers = llama_model_n_layer(model);
    int n_embd = llama_model_n_embd(model);

    // get model hint param (a.k.a model arch name)
    char model_hint[128];
    llama_model_meta_val_str(model, "general.architecture", model_hint, 128);

    // init train_context
    train_context ctx_train(n_embd, n_layers);

    // load and prepare entries for training
    prepare_entries(params, ctx_train);

    // we have to pretokenize everything because otherwise we don't know how much overhead to allocate ctx_diffs_wrapped
    std::vector<tokenized_prompt> tokenized_prompts;
    size_t n_total_tokens = 0;
    for (size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        tokenized_prompt t(ctx, ctx_train.positive_entries[i], ctx_train.negative_entries[i]);
        n_total_tokens += 2 * t.max_seq_len;
        tokenized_prompts.push_back(std::move(t));
    }

    std::cout << "n_total_tokens: " << n_total_tokens << std::endl;

    for(size_t i = 0; i < ctx_train.positive_entries.size(); ++i) {
        bool success = false;
        tokenized_prompt t = tokenized_prompts[i];
        cb_data.n_layers = n_layers;
        cb_data.n_tokens = t.max_seq_len;

        printf("Evaluating prompt[%d/%d]: \"%s\" - \"%s\" (%d tokens)\n",
            (int) i+1, (int) ctx_train.positive_entries.size(),
            tokens_to_str(ctx, t.tokens_pos.cbegin(), t.tokens_pos.cend()).c_str(),
            tokens_to_str(ctx, t.tokens_neg.cbegin(), t.tokens_neg.cend()).c_str(),
            (int) t.max_seq_len);

        cb_data.is_eval_pos = true;
        success = get_hidden_layers(ctx, t.tokens_pos);
        if (!success) break;

        cb_data.is_eval_pos = false;
        success = get_hidden_layers(ctx, t.tokens_neg);
        if (!success) break;

        // calculate diff and remove all zero rows
        auto v_diff_filtered = cb_data.calc_diff();

        // save & concat the filtered v_diff to ctx_train
        ctx_train.concat_diff_tmp(v_diff_filtered);

        // reset for next iteration
        cb_data.reset();
    }

    // done with the model, we can now free it to make gain some memory
    printf("Done evaluate prompts, unload model...\n");

    bool use_pca = params.cvector_dimre_method == DIMRE_METHOD_PCA;

    // prepare ctx_train for PCA
    ctx_train.build_v_diff(use_pca);

    if (use_pca) {
        // run PCA
        PCA::pca_params pca_params;
        pca_params.n_threads    = params.cpuparams.n_threads;
        pca_params.n_batch      = params.n_pca_batch;
        pca_params.n_iterations = params.n_pca_iterations;
        PCA::run_pca(pca_params, ctx_train.v_diff, ctx_train.v_final);
    } else {
        // run mean
        mean::run(ctx_train.v_diff, ctx_train.v_final);
    }

    // write output vectors to gguf
    export_gguf(ctx_train.v_final, params.out_file, model_hint);

    llama_backend_free();

    return 0;
}